

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void OpenTapFile(path *tapename,int flagbyte)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  byte tap_data [3];
  undefined5 uStack_35;
  
  CloseTapFile();
  FP_tapout = SJ_fopen(tapename,"r+b");
  if ((FILE *)FP_tapout == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string((string *)tap_data,tapename);
    Error("opening file for write",(char *)CONCAT53(uStack_35,CONCAT12(tap_data[2],tap_data._0_2_)),
          PASS3);
    std::__cxx11::string::~string((string *)tap_data);
  }
  else {
    iVar1 = fseek((FILE *)FP_tapout,0,2);
    if (iVar1 != 0) {
      std::filesystem::__cxx11::path::string((string *)tap_data,tapename);
      Error("File seek end error in TAPOUT",
            (char *)CONCAT53(uStack_35,CONCAT12(tap_data[2],tap_data._0_2_)),FATAL);
      std::__cxx11::string::~string((string *)tap_data);
    }
    lVar2 = ftell((FILE *)FP_tapout);
    tape_seek = (int)lVar2;
    tap_data[0] = '\0';
    tap_data[1] = '\0';
    tape_length = 2;
    tape_parity = flagbyte;
    tap_data[2] = (byte)flagbyte;
    sVar3 = fwrite(tap_data,1,3,(FILE *)FP_tapout);
    if (sVar3 != 3) {
      fclose((FILE *)FP_tapout);
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
  }
  return;
}

Assistant:

void OpenTapFile(const std::filesystem::path & tapename, int flagbyte)
{
	CloseTapFile();

	if (!FOPEN_ISOK(FP_tapout,tapename, "r+b")) {
		Error( "opening file for write", tapename.string().c_str());
		return;
	}
	if (fseek(FP_tapout, 0, SEEK_END)) Error("File seek end error in TAPOUT", tapename.string().c_str(), FATAL);

	tape_seek = ftell(FP_tapout);
	tape_parity = flagbyte;
	tape_length = 2;

	byte tap_data[3] = { 0, 0, (byte)flagbyte };

	if (sizeof(tap_data) != fwrite(tap_data, 1, sizeof(tap_data), FP_tapout)) {
		fclose(FP_tapout);
		Error("Write error (disk full?)", NULL, FATAL);
	}
}